

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O0

distFcnElement2d * __thiscall
amrex::LineDistFcnElement2d::newDistFcnElement2d(LineDistFcnElement2d *this)

{
  distFcnElement2d *pdVar1;
  LineDistFcnElement2d *in_RDI;
  LineDistFcnElement2d *newLine;
  vector<double,_std::allocator<double>_> *in_stack_00000068;
  vector<double,_std::allocator<double>_> *in_stack_00000070;
  
  pdVar1 = (distFcnElement2d *)operator_new(0x38);
  LineDistFcnElement2d(in_RDI);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000070,in_stack_00000068);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000070,in_stack_00000068);
  return pdVar1;
}

Assistant:

distFcnElement2d* LineDistFcnElement2d::newDistFcnElement2d() const {
  LineDistFcnElement2d* newLine = new LineDistFcnElement2d();
  newLine->control_points_x = control_points_x;
  newLine->control_points_y = control_points_y;
  return static_cast<distFcnElement2d*>(newLine);
}